

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::AppendSuccessInformation(cmFindPackageCommand *this)

{
  cmAlphaNum *this_00;
  cmState *pcVar1;
  ulong uVar2;
  char *pcVar3;
  char *local_3b8;
  byte local_3a3;
  cmAlphaNum local_368;
  cmAlphaNum local_338;
  undefined1 local_308 [8];
  string requiredInfoPropName;
  cmAlphaNum local_2b8;
  string local_288;
  string local_268 [8];
  string versionInfo;
  cmAlphaNum local_218;
  undefined1 local_1e8 [8];
  string versionInfoPropName;
  cmAlphaNum local_198;
  undefined1 local_168 [8];
  string quietInfoPropName;
  undefined1 local_140 [5];
  bool packageFound;
  bool result;
  bool upperResult;
  string upperFound;
  cmAlphaNum local_f0;
  undefined1 local_c0 [8];
  string found;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  undefined1 local_30 [8];
  string transitivePropName;
  cmFindPackageCommand *this_local;
  
  transitivePropName.field_2._8_8_ = this;
  cmAlphaNum::cmAlphaNum(&local_60,"_CMAKE_");
  cmAlphaNum::cmAlphaNum(&local_90,&this->Name);
  cmStrCat<char[23]>((string *)local_30,&local_60,&local_90,(char (*) [23])"_TRANSITIVE_DEPENDENCY")
  ;
  pcVar1 = cmMakefile::GetState((this->super_cmFindCommon).Makefile);
  cmState::SetGlobalProperty(pcVar1,(string *)local_30,"False");
  std::__cxx11::string::~string((string *)local_30);
  cmAlphaNum::cmAlphaNum(&local_f0,&this->Name);
  this_00 = (cmAlphaNum *)((long)&upperFound.field_2 + 8);
  cmAlphaNum::cmAlphaNum(this_00,"_FOUND");
  cmStrCat<>((string *)local_c0,&local_f0,this_00);
  cmsys::SystemTools::UpperCase((string *)local_140,(string *)local_c0);
  quietInfoPropName.field_2._M_local_buf[0xf] =
       cmMakefile::IsOn((this->super_cmFindCommon).Makefile,(string *)local_140);
  quietInfoPropName.field_2._M_local_buf[0xe] =
       cmMakefile::IsOn((this->super_cmFindCommon).Makefile,(string *)local_c0);
  local_3a3 = 1;
  if (!(bool)quietInfoPropName.field_2._M_local_buf[0xe]) {
    local_3a3 = quietInfoPropName.field_2._M_local_buf[0xf];
  }
  quietInfoPropName.field_2._M_local_buf[0xd] = local_3a3 & 1;
  AppendToFoundProperty(this,(bool)quietInfoPropName.field_2._M_local_buf[0xd]);
  cmAlphaNum::cmAlphaNum(&local_198,"_CMAKE_");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&versionInfoPropName.field_2 + 8),&this->Name);
  cmStrCat<char[7]>((string *)local_168,&local_198,
                    (cmAlphaNum *)((long)&versionInfoPropName.field_2 + 8),(char (*) [7])0xd3da29);
  pcVar1 = cmMakefile::GetState((this->super_cmFindCommon).Makefile);
  pcVar3 = "FALSE";
  if ((this->Quiet & 1U) != 0) {
    pcVar3 = "TRUE";
  }
  cmState::SetGlobalProperty(pcVar1,(string *)local_168,pcVar3);
  cmAlphaNum::cmAlphaNum(&local_218,"_CMAKE_");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&versionInfo.field_2 + 8),&this->Name);
  cmStrCat<char[18]>((string *)local_1e8,&local_218,(cmAlphaNum *)((long)&versionInfo.field_2 + 8),
                     (char (*) [18])0xd37e14);
  std::__cxx11::string::string(local_268);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator=(local_268,(string *)&this->VersionRange);
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      if ((this->VersionExact & 1U) == 0) {
        local_3b8 = ">=";
      }
      else {
        local_3b8 = "==";
      }
      cmAlphaNum::cmAlphaNum(&local_2b8,local_3b8);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&requiredInfoPropName.field_2 + 8),' ');
      cmStrCat<std::__cxx11::string>
                (&local_288,&local_2b8,(cmAlphaNum *)((long)&requiredInfoPropName.field_2 + 8),
                 &this->Version);
      std::__cxx11::string::operator=(local_268,(string *)&local_288);
      std::__cxx11::string::~string((string *)&local_288);
    }
  }
  pcVar1 = cmMakefile::GetState((this->super_cmFindCommon).Makefile);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmState::SetGlobalProperty(pcVar1,(string *)local_1e8,pcVar3);
  if ((this->Required & 1U) != 0) {
    cmAlphaNum::cmAlphaNum(&local_338,"_CMAKE_");
    cmAlphaNum::cmAlphaNum(&local_368,&this->Name);
    cmStrCat<char[6]>((string *)local_308,&local_338,&local_368,(char (*) [6])0xd18410);
    pcVar1 = cmMakefile::GetState((this->super_cmFindCommon).Makefile);
    cmState::SetGlobalProperty(pcVar1,(string *)local_308,"REQUIRED");
    std::__cxx11::string::~string((string *)local_308);
  }
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)local_c0);
  return;
}

Assistant:

void cmFindPackageCommand::AppendSuccessInformation()
{
  {
    std::string const transitivePropName =
      cmStrCat("_CMAKE_", this->Name, "_TRANSITIVE_DEPENDENCY");
    this->Makefile->GetState()->SetGlobalProperty(transitivePropName, "False");
  }
  std::string const found = cmStrCat(this->Name, "_FOUND");
  std::string const upperFound = cmSystemTools::UpperCase(found);

  bool const upperResult = this->Makefile->IsOn(upperFound);
  bool const result = this->Makefile->IsOn(found);
  bool const packageFound = (result || upperResult);

  this->AppendToFoundProperty(packageFound);

  // Record whether the find was quiet or not, so this can be used
  // e.g. in FeatureSummary.cmake
  std::string const quietInfoPropName =
    cmStrCat("_CMAKE_", this->Name, "_QUIET");
  this->Makefile->GetState()->SetGlobalProperty(
    quietInfoPropName, this->Quiet ? "TRUE" : "FALSE");

  // set a global property to record the required version of this package
  std::string const versionInfoPropName =
    cmStrCat("_CMAKE_", this->Name, "_REQUIRED_VERSION");
  std::string versionInfo;
  if (!this->VersionRange.empty()) {
    versionInfo = this->VersionRange;
  } else if (!this->Version.empty()) {
    versionInfo =
      cmStrCat(this->VersionExact ? "==" : ">=", ' ', this->Version);
  }
  this->Makefile->GetState()->SetGlobalProperty(versionInfoPropName,
                                                versionInfo.c_str());
  if (this->Required) {
    std::string const requiredInfoPropName =
      cmStrCat("_CMAKE_", this->Name, "_TYPE");
    this->Makefile->GetState()->SetGlobalProperty(requiredInfoPropName,
                                                  "REQUIRED");
  }
}